

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O0

void __thiscall DynamicGraph::deleteEdge(DynamicGraph *this,Vertex *v,Vertex *u)

{
  edge_desc_impl<boost::undirected_tag,_unsigned_long> e_00;
  Edge e_01;
  runtime_error *this_00;
  invalid_argument *this_01;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *in_R8;
  pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> local_88;
  unsigned_long local_68;
  Edge e;
  byte local_38;
  bool edgeExist;
  Vertex *u_local;
  Vertex *v_local;
  DynamicGraph *this_local;
  
  if ((this->isInitialized & 1U) == 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Dynamic Graph not initialized!");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
            ((pair<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_bool> *)
             &e.m_eproperty,(boost *)*v,*u,(vertex_descriptor)this,in_R8);
  if ((local_38 & 1) == 0) {
    this_01 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_01,"Edge does not exist");
    __cxa_throw(this_01,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  boost::
  edge<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config,boost::undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>>
            (&local_88,(boost *)*v,*u,(vertex_descriptor)this,in_R8);
  local_68 = local_88.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
  e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
       local_88.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
  e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
       (unsigned_long)local_88.first.m_eproperty;
  e_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
       local_88.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
  e_00.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source =
       local_88.first.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
  e_00.m_eproperty = local_88.first.m_eproperty;
  boost::
  remove_edge<boost::detail::edge_desc_impl<boost::undirected_tag,unsigned_long>,boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::vecS,boost::undirectedS,boost::no_property,boost::no_property,boost::no_property,boost::listS>::config>
            (e_00,(undirected_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::undirectedS,_boost::no_property,_boost::no_property,_boost::no_property,_boost::listS>::config>
                   *)this);
  e_01.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target =
       e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source;
  e_01.super_edge_base<boost::undirected_tag,_unsigned_long>.m_source = local_68;
  e_01.m_eproperty =
       (property_type *)e.super_edge_base<boost::undirected_tag,_unsigned_long>.m_target;
  handleDeletion(this,e_01);
  return;
}

Assistant:

void DynamicGraph::deleteEdge(const Vertex &v, const Vertex &u)
{
    if(!this->isInitialized) {
        throw std::runtime_error("Dynamic Graph not initialized!");
    }

    bool edgeExist = edge(v,u,*this).second;
    if (!edgeExist) {
        throw std::invalid_argument("Edge does not exist");
    }
    Edge e = edge(v,u,*this).first;
    boost::remove_edge(e, *this);
    this->handleDeletion(e);
}